

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void showMemInfo(void)

{
  char *__s;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long lVar3;
  _List_node_base *p_Var4;
  ostream *poVar5;
  long *plVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  
  printSplitLine();
  iVar9 = 0;
  iVar8 = 0;
  if (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
    iVar8 = 0;
    p_Var4 = freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    do {
      p_Var1 = p_Var4 + 1;
      p_Var4 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var4->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
      iVar8 = iVar8 + *(int *)((long)&p_Var1->_M_next->_M_next + 4);
    } while (p_Var4 != (_List_node_base *)&freeMemBlockList_abi_cxx11_);
  }
  if (usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&usedMemBlockList_abi_cxx11_) {
    iVar9 = 0;
    p_Var4 = usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    do {
      p_Var1 = p_Var4 + 1;
      p_Var4 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var4->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
      iVar9 = iVar9 + *(int *)((long)&p_Var1->_M_next->_M_next + 4);
    } while (p_Var4 != (_List_node_base *)&usedMemBlockList_abi_cxx11_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main mem info:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\ttotal: ",8);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,memSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tused: ",8);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tfree: ",8);
  plVar6 = (long *)std::ostream::operator<<(poVar5,iVar8);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"used mem info:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tfrom\tto  \tsize\townerProcess",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  for (p_Var4 = processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)&processList_abi_cxx11_;
      p_Var4 = (((_List_base<Process_*,_std::allocator<Process_*>_> *)&p_Var4->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    p_Var1 = p_Var4[1]._M_next;
    p_Var2 = p_Var1[3]._M_prev;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    lVar3 = std::cout;
    *(uint *)(strtok + *(long *)(std::cout + -0x18)) =
         *(uint *)(strtok + *(long *)(std::cout + -0x18)) | 0x20;
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar3 + -0x18)) = 7;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var2->_M_next);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    lVar3 = *(long *)poVar5;
    *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,*(int *)&p_Var2->_M_next + *(int *)((long)&p_Var2->_M_next + 4) + -1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    lVar3 = *(long *)poVar5;
    *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)((long)&p_Var2->_M_next + 4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) | 0x20;
    __s = (char *)((long)&p_Var1->_M_next + 4);
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var1->_M_next);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node
      ._M_size == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"none",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"free mem info:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tfrom\tto  \tsize",0xf)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  p_Var4 = freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
    do {
      p_Var1 = p_Var4[1]._M_next;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      lVar3 = std::cout;
      *(uint *)(strtok + *(long *)(std::cout + -0x18)) =
           *(uint *)(strtok + *(long *)(std::cout + -0x18)) | 0x20;
      *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar3 + -0x18)) = 7;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var1->_M_next);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      lVar3 = *(long *)poVar5;
      *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
      *(undefined8 *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)&p_Var1->_M_next + *(int *)((long)&p_Var1->_M_next + 4) +
                                 -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) | 0x20;
      plVar6 = (long *)std::ostream::operator<<(poVar5,*(int *)((long)&p_Var1->_M_next + 4));
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      p_Var4 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var4->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)&freeMemBlockList_abi_cxx11_);
  }
  if (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"none",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  printSplitLine();
  return;
}

Assistant:

void showMemInfo() {
    printSplitLine();
    // 先输出概况
    int allFreeSize = 0, allUsedSize = 0;
    for (MemBlock *i : freeMemBlockList) allFreeSize += i->length;
    for (MemBlock *i : usedMemBlockList) allUsedSize += i->length;
    cout << "main mem info:" << endl;
    cout << "\ttotal: " << memSize
         << "\t\tused: " << allUsedSize
         << "\t\tfree: " << allFreeSize
         << endl;
    cout << endl;
    cout << "used mem info:" << endl;
    cout << "\tfrom\tto  \tsize\townerProcess" << endl;
    // 输出已经被使用的内存块情况
    for (Process *i : processList) {
        MemBlock *used = i->memBlock;
        cout << "\t" << setiosflags(ios::left) << setw(7) << used->start
             << " " << setiosflags(ios::left) << setw(7) << used->start + used->length - 1
             << " " << setiosflags(ios::left) << setw(7) << used->length
             << " " << setiosflags(ios::left) << i->name << "(" << i->pid << ")"
             << endl;
    }
    if (processList.size() == 0) cout << "\t" << "none" << endl;
    cout << endl;
    // 输出空闲内存块情况
    cout << "free mem info:" << endl;
    cout << "\tfrom\tto  \tsize" << endl;
    for (MemBlock *i : freeMemBlockList)
        cout << "\t" << setiosflags(ios::left) << setw(7) << i->start
             << " " << setiosflags(ios::left) << setw(7) << i->start + i->length - 1
             << " " << setiosflags(ios::left) << i->length
             << endl;
    if (freeMemBlockList.size() == 0) cout << "\t" << "none" << endl;
    printSplitLine();
}